

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

bool __thiscall QAccessibleTableCell::isSelected(QAccessibleTableCell *this)

{
  char cVar1;
  undefined1 uVar2;
  QModelIndex *pQVar3;
  long in_FS_OFFSET;
  QModelIndex QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x10))();
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    pQVar3 = (QModelIndex *)
             QAbstractItemView::selectionModel((QAbstractItemView *)(this->view).wp.value);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&QStack_38,&this->m_index);
    uVar2 = QItemSelectionModel::isSelected(pQVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTableCell::isSelected() const
{
    if (!isValid())
        return false;
    return view->selectionModel()->isSelected(m_index);
}